

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateProto3DefaultValue_Test::TestBody
          (ValidationErrorTest_ValidateProto3DefaultValue_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a0
  ;
  allocator<char> local_81;
  string local_80;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60
  ;
  allocator<char> local_31;
  string local_30;
  ValidationErrorTest_ValidateProto3DefaultValue_Test *local_10;
  ValidationErrorTest_ValidateProto3DefaultValue_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "name: \'foo.proto\' syntax: \'proto3\' message_type {   name: \'Foo\'   field { name:\'foo\' number:1 label:LABEL_OPTIONAL type:TYPE_INT32           default_value: \'1\' }}"
             ,&local_31);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_60,
            "foo.proto: Foo.foo: DEFAULT_VALUE: Explicit default values are not allowed in proto3.\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_30,&local_60);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_60);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "name: \'foo.proto\' syntax: \'proto3\' message_type {   name: \'Foo\'   nested_type {     name : \'Bar\'     field { name:\'bar\' number:1 label:LABEL_OPTIONAL type:TYPE_INT32             default_value: \'1\' }  } }"
             ,&local_81);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_a0,
            "foo.proto: Foo.Bar.bar: DEFAULT_VALUE: Explicit default values are not allowed in proto3.\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_80,&local_a0);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateProto3DefaultValue) {
  BuildFileWithErrors(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type { "
      "  name: 'Foo' "
      "  field { name:'foo' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 "
      "          default_value: '1' }"
      "}",
      "foo.proto: Foo.foo: DEFAULT_VALUE: Explicit default values are not "
      "allowed in proto3.\n");

  BuildFileWithErrors(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type { "
      "  name: 'Foo' "
      "  nested_type { "
      "    name : 'Bar' "
      "    field { name:'bar' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 "
      "            default_value: '1' }"
      "  } "
      "}",
      "foo.proto: Foo.Bar.bar: DEFAULT_VALUE: Explicit default values are not "
      "allowed in proto3.\n");
}